

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall IdsTable::print(IdsTable *this)

{
  Symbol *pSVar1;
  int i;
  long lVar2;
  
  puts(&DAT_00118676);
  puts("-------------------------------------------");
  printf("LEXEMA\t\t");
  puts("\n-------------------------------------------");
  lVar2 = 0;
  do {
    for (pSVar1 = (this->super_SymbolTable).block[lVar2]; pSVar1 != (Symbol *)0x0;
        pSVar1 = pSVar1->nextSymbol) {
      printf("%s\t\t",(this->super_SymbolTable).lexemeArray + pSVar1->scope);
      putchar(10);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x65);
  putchar(10);
  return;
}

Assistant:

void IdsTable::print() {
    printf("\nTABELA DE SÍMBOLOS: LITERAIS\n");
    printf("-------------------------------------------\n");

    //Check if column names headers needs to be printed
    //If necessary, print selected;
    printf("LEXEMA\t\t");
    printf("\n-------------------------------------------\n");

    for (int i = 0; i < TABLE_SIZE; ++i) { //Get all the entries

        Symbol *temp = block[i];
        if (temp == nullptr) //If its null, nothing to be done
        {
            continue;
        }

        while (temp != nullptr) {
            //Verify flags to print only requested columns
            printf("%s\t\t", this->lexemeArray + temp->getScope());

            printf("\n");
            temp = temp->getNextSymbol();
        }
    }
    printf("\n");
}